

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall dg::vr::StructureAnalyzer::findLoops(StructureAnalyzer *this)

{
  pointer *pppVVar1;
  _Rb_tree_header *p_Var2;
  VRLocation *this_00;
  VRLocation *pVVar3;
  VRLocation *pVVar4;
  _Link_type p_Var5;
  ulong uVar6;
  ulong uVar7;
  iterator __position;
  iterator __position_00;
  char cVar8;
  bool bVar9;
  _Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>
  _Var10;
  pointer puVar11;
  long lVar12;
  _Link_type p_Var13;
  long lVar14;
  Function *f;
  _Link_type this_01;
  _Link_type p_Var15;
  _Link_type p_Var16;
  ulong uVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>,_bool>
  pVar18;
  LazyDFS it_1;
  set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  backwardReach;
  VREdge *edge;
  LazyDFS it;
  Instruction *local_170;
  void *local_168;
  _Rb_tree_node_base _Stack_160;
  pointer local_130;
  pointer local_128;
  pointer local_120;
  _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  local_110;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_e0;
  _Link_type local_d0;
  pointer local_a8;
  pointer local_98;
  LazyDFS local_88;
  
  lVar12 = *(long *)(*(long *)this + 0x20);
  lVar14 = *(long *)this + 0x18;
  if (lVar12 != lVar14) {
    p_Var2 = &local_110._M_impl.super__Rb_tree_header;
    do {
      f = (Function *)(lVar12 + -0x38);
      if (lVar12 == 0) {
        f = (Function *)0x0;
      }
      cVar8 = llvm::GlobalValue::isDeclaration();
      if (cVar8 == '\0') {
        VRCodeGraph::lazy_dfs_begin(&local_88,*(VRCodeGraph **)(this + 8),f);
        while( true ) {
          VRCodeGraph::lazy_dfs_end();
          bVar9 = operator==(&local_88,(LazyDFS *)&local_168);
          if (local_130 != (pointer)0x0) {
            operator_delete(local_130,(long)local_120 - (long)local_130);
          }
          this_01 = (_Link_type)_Stack_160._M_parent;
          std::
          _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
          ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                      *)&local_168,(_Link_type)_Stack_160._M_parent);
          if (bVar9) break;
          this_00 = local_88.stack.
                    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                    super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
          bVar9 = VRLocation::isJustLoopJoin(this_00);
          if (bVar9) {
            collectBackward((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                             *)&local_110,(StructureAnalyzer *)this_01,f,this_00);
            local_168 = (void *)0x0;
            _Stack_160._M_color = _S_red;
            _Stack_160._4_4_ = 0;
            _Stack_160._M_parent = (_Base_ptr)0x0;
            local_e0._M_head_impl = (VREdge *)this_00;
            pVar18 = std::
                     _Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                     ::
                     _M_emplace_unique<dg::vr::VRLocation*,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>
                               ((_Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                                 *)(this + 0x10),(VRLocation **)&local_e0,
                                (vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                                 *)&local_168);
            _Var10 = pVar18.first._M_node;
            if (local_168 != (void *)0x0) {
              operator_delete(local_168,(long)_Stack_160._M_parent - (long)local_168);
            }
            VRCodeGraph::lazy_dfs_begin((LazyDFS *)&local_168,*(VRCodeGraph **)(this + 8),f,this_00)
            ;
            while( true ) {
              VRCodeGraph::lazy_dfs_end();
              bVar9 = operator==((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)&local_168,
                                 (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)&local_e0);
              if (local_a8 != (pointer)0x0) {
                operator_delete(local_a8,(long)local_98 - (long)local_a8);
              }
              std::
              _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
              ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                          *)&local_e0,local_d0);
              if (bVar9) break;
              if ((_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent !=
                  (_Link_type)0x0) {
                pVVar3 = local_128[-1].
                         super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>
                         .super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
                p_Var5 = (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var16 = (_Link_type)p_Var2;
                do {
                  p_Var15 = p_Var16;
                  p_Var13 = p_Var5;
                  pVVar4 = *(VRLocation **)(p_Var13->_M_storage)._M_storage;
                  p_Var16 = p_Var13;
                  if (pVVar4 < pVVar3) {
                    p_Var16 = p_Var15;
                  }
                  p_Var5 = *(_Link_type *)
                            (&p_Var13->_M_storage)[(ulong)(pVVar4 < pVVar3) - 2]._M_storage;
                } while (p_Var5 != (_Link_type)0x0);
                if ((_Rb_tree_header *)p_Var16 != p_Var2) {
                  if (pVVar4 < pVVar3) {
                    p_Var13 = p_Var15;
                  }
                  if (*(VRLocation **)(p_Var13->_M_storage)._M_storage <= pVVar3) {
                    puVar11 = (pVVar3->successors).
                              super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((int)((ulong)((long)(pVVar3->successors).
                                            super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar11) >> 3) != 0) {
                      uVar17 = 0;
                      do {
                        local_e0._M_head_impl =
                             *(VREdge **)
                              &puVar11[uVar17]._M_t.
                               super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>
                               ._M_t;
                        uVar6 = *(ulong *)((long)local_e0._M_head_impl + 8);
                        if (uVar6 != 0) {
                          p_Var5 = (_Link_type)
                                   local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
                          p_Var16 = (_Link_type)p_Var2;
                          if ((_Link_type)
                              local_110._M_impl.super__Rb_tree_header._M_header._M_parent !=
                              (_Link_type)0x0) {
                            do {
                              p_Var15 = p_Var16;
                              p_Var13 = p_Var5;
                              uVar7 = *(ulong *)(p_Var13->_M_storage)._M_storage;
                              p_Var16 = p_Var13;
                              if (uVar7 < uVar6) {
                                p_Var16 = p_Var15;
                              }
                              p_Var5 = *(_Link_type *)
                                        (&p_Var13->_M_storage)[(ulong)(uVar7 < uVar6) - 2].
                                        _M_storage;
                            } while (p_Var5 != (_Link_type)0x0);
                            if ((_Rb_tree_header *)p_Var16 != p_Var2) {
                              if (uVar7 < uVar6) {
                                p_Var13 = p_Var15;
                              }
                              if (*(ulong *)(p_Var13->_M_storage)._M_storage <= uVar6) {
                                if (*(int *)(*(long *)((long)local_e0._M_head_impl + 0x10) + 8) == 1
                                   ) {
                                  local_170 = *(Instruction **)
                                               (*(long *)((long)local_e0._M_head_impl + 0x10) + 0x10
                                               );
                                  __position_00._M_current =
                                       (Instruction **)_Var10._M_node[1]._M_left;
                                  if ((_Base_ptr)__position_00._M_current ==
                                      _Var10._M_node[1]._M_right) {
                                    std::
                                    vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                                    ::_M_realloc_insert<llvm::Instruction_const*>
                                              ((vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                                                *)&_Var10._M_node[1]._M_parent,__position_00,
                                               &local_170);
                                  }
                                  else {
                                    *__position_00._M_current = local_170;
                                    _Var10._M_node[1]._M_left =
                                         (_Base_ptr)&(_Var10._M_node[1]._M_left)->_M_parent;
                                  }
                                }
                                goto LAB_001261af;
                              }
                            }
                          }
                          __position._M_current =
                               (this_00->loopEnds).
                               super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_00->loopEnds).
                              super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>
                            ::_M_realloc_insert<dg::vr::VREdge*&>
                                      ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>
                                        *)&this_00->loopEnds,__position,(VREdge **)&local_e0);
                          }
                          else {
                            *__position._M_current = local_e0._M_head_impl;
                            pppVVar1 = &(this_00->loopEnds).
                                        super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish;
                            *pppVVar1 = *pppVVar1 + 1;
                          }
                        }
LAB_001261af:
                        uVar17 = uVar17 + 1;
                        puVar11 = (pVVar3->successors).
                                  super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      } while (uVar17 < ((ulong)((long)(pVVar3->successors).
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar11) >> 3 & 0xffffffff));
                    }
                    if ((pVVar3 != this_00) &&
                       ((pVVar3->join == (VRLocation *)0x0 || (this_00->join != (VRLocation *)0x0)))
                       ) {
                      pVVar3->join = this_00;
                    }
                  }
                }
              }
              VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++
                        ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)&local_168);
            }
            if (local_130 != (pointer)0x0) {
              operator_delete(local_130,(long)local_120 - (long)local_130);
            }
            std::
            _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
            ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                        *)&local_168,(_Link_type)_Stack_160._M_parent);
            std::
            _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
            ::_M_erase(&local_110,
                       (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&local_88);
        }
        if (local_88.stack.
            super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.stack.
                          super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                    *)&local_88,
                   (_Link_type)
                   local_88.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
      }
      lVar12 = *(long *)(lVar12 + 8);
    } while (lVar12 != lVar14);
  }
  return;
}

Assistant:

void StructureAnalyzer::findLoops() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.lazy_dfs_begin(function);
             it != codeGraph.lazy_dfs_end(); ++it) {
            VRLocation &location = *it;

            if (!location.isJustLoopJoin())
                continue;

            auto backwardReach = collectBackward(function, location);

            auto &loop =
                    inloopValues
                            .emplace(&location,
                                     std::vector<const llvm::Instruction *>())
                            .first->second;

            for (auto it = codeGraph.lazy_dfs_begin(function, location);
                 it != codeGraph.lazy_dfs_end(); ++it) {
                VRLocation &source = *it;

                if (backwardReach.find(&source) == backwardReach.end())
                    continue;

                for (size_t i = 0; i < source.succsSize(); ++i) {
                    VREdge *edge = source.getSuccEdge(i);
                    if (!edge->target)
                        continue;

                    if (backwardReach.find(edge->target) !=
                        backwardReach.end()) {
                        if (edge->op->isInstruction()) {
                            auto *op = static_cast<VRInstruction *>(
                                    edge->op.get());
                            loop.emplace_back(op->getInstruction());
                        }
                    } else
                        location.loopEnds.emplace_back(edge);
                }

                if (&source != &location && (!source.join || location.join))
                    source.join = &location;
            }
        }
    }
}